

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateMethods
          (EnumGenerator *this,int idx,Printer *printer)

{
  _Rb_tree_header *p_Var1;
  EnumDescriptor *descriptor;
  long lVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *descriptor_00;
  EnumValueDescriptor *extraout_RDX_02;
  EnumValueDescriptor *enum_value;
  EnumValueDescriptor *extraout_RDX_03;
  int i_1;
  int j;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  long lVar11;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar12;
  undefined1 auVar13 [16];
  int data_index;
  int i;
  _Base_ptr local_138;
  int idx_local;
  Formatter format;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  name_to_number;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> number_to_index;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  number_to_canonical_name;
  set<int,_std::less<int>,_std::allocator<int>_> numbers;
  
  idx_local = idx;
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  bVar3 = HasDescriptorMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_);
  if (bVar3) {
    Formatter::operator()
              (&format,
               "const ::$proto_ns$::EnumDescriptor* $classname$_descriptor() {\n  ::$proto_ns$::internal::AssignDescriptors(&$desc_table$);\n  return $file_level_enum_descriptors$[$1$];\n}\n"
               ,&idx_local);
  }
  Formatter::operator()<>(&format,"bool $classname$_IsValid(int value) {\n  switch (value) {\n");
  p_Var1 = &numbers._M_t._M_impl.super__Rb_tree_header;
  numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  numbers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar11 = 4;
  lVar9 = 0;
  uVar8 = extraout_RDX;
  numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; auVar13._8_8_ = uVar8,
      auVar13._0_8_ = numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      lVar9 < *(int *)(this->descriptor_ + 4); lVar9 = lVar9 + 1) {
    name_to_number._M_t._M_impl._0_4_ =
         *(undefined4 *)(*(long *)(this->descriptor_ + 0x28) + lVar11);
    pVar12 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
             _M_insert_unique<int>(&numbers._M_t,(int *)&name_to_number);
    uVar8 = pVar12._8_8_;
    lVar11 = lVar11 + 0x20;
  }
  while (p_Var10 = auVar13._0_8_, (_Rb_tree_header *)p_Var10 != p_Var1) {
    Int32ToString_abi_cxx11_
              ((string *)&name_to_number,(cpp *)(ulong)p_Var10[1]._M_color,auVar13._8_4_);
    Formatter::operator()(&format,"    case $1$:\n",(string *)&name_to_number);
    std::__cxx11::string::~string((string *)&name_to_number);
    auVar13 = std::_Rb_tree_increment(p_Var10);
  }
  Formatter::operator()<>
            (&format,"      return true;\n    default:\n      return false;\n  }\n}\n\n");
  bVar3 = HasDescriptorMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_);
  descriptor_00 = extraout_RDX_00;
  if (!bVar3) {
    p_Var1 = &name_to_number._M_t._M_impl.super__Rb_tree_header;
    name_to_number._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    name_to_number._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    name_to_number._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_header;
    number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar11 = 8;
    lVar9 = 0;
    name_to_number._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    name_to_number._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (; descriptor = this->descriptor_, lVar9 < *(int *)(descriptor + 4); lVar9 = lVar9 + 1) {
      lVar2 = *(long *)(descriptor + 0x28);
      number_to_index._M_t._M_impl._0_4_ = *(undefined4 *)(lVar2 + -4 + lVar11);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,int>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  *)&name_to_number,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar2 + lVar11),(int *)&number_to_index);
      number_to_index._M_t._M_impl._0_4_ = *(undefined4 *)(lVar2 + -4 + lVar11);
      std::
      _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
      ::_M_emplace_unique<int,std::__cxx11::string_const&>
                ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  *)&number_to_canonical_name,(int *)&number_to_index,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar2 + lVar11));
      lVar11 = lVar11 + 0x20;
    }
    number_to_index._M_t._M_impl._0_4_ = anon_unknown_6::CountUniqueValues(descriptor);
    Formatter::operator()
              (&format,
               "static ::$proto_ns$::internal::ExplicitlyConstructed<std::string> $classname$_strings[$1$] = {};\n\n"
               ,(int *)&number_to_index);
    Formatter::operator()<>(&format,"static const char $classname$_names[] =");
    for (p_Var6 = name_to_number._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      Formatter::operator()
                (&format,"\n  \"$1$\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1));
    }
    Formatter::operator()<>(&format,";\n\n");
    Formatter::operator()<>
              (&format,"static const ::$proto_ns$::internal::EnumEntry $classname$_entries[] = {\n")
    ;
    i = 0;
    number_to_index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &number_to_index._M_t._M_impl.super__Rb_tree_header._M_header;
    number_to_index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    number_to_index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    number_to_index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    data_index = 0;
    number_to_index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         number_to_index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var6 = name_to_number._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      local_138 = p_Var6[1]._M_parent;
      p_Var10 = p_Var6 + 2;
      Formatter::operator()
                (&format,"  { {$classname$_names + $1$, $2$}, $3$ },\n",&data_index,
                 (unsigned_long *)&local_138,(int *)p_Var10);
      pmVar7 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&number_to_canonical_name,(key_type *)p_Var10);
      _Var4 = std::operator==(pmVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(p_Var6 + 1));
      if (_Var4) {
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<int_const&,int&>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)&number_to_index,(int *)p_Var10,&i);
      }
      i = i + 1;
      data_index = data_index + *(int *)&p_Var6[1]._M_parent;
    }
    Formatter::operator()<>(&format,"};\n\nstatic const int $classname$_entries_by_number[] = {\n");
    for (p_Var6 = number_to_index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &number_to_index._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar7 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&number_to_canonical_name,(key_type *)(p_Var6 + 1));
      Formatter::operator()
                (&format,"  $1$, // $2$ -> $3$\n",(int *)&p_Var6[1].field_0x4,(int *)(p_Var6 + 1),
                 pmVar7);
    }
    Formatter::operator()<>(&format,"};\n\n");
    iVar5 = anon_unknown_6::CountUniqueValues(this->descriptor_);
    local_138._0_4_ = iVar5;
    Formatter::operator()
              (&format,
               "const std::string& $classname$_Name(\n    $classname$ value) {\n  static const bool dummy =\n      ::$proto_ns$::internal::InitializeEnumStrings(\n          $classname$_entries,\n          $classname$_entries_by_number,\n          $1$, $classname$_strings);\n  (void) dummy;\n  int idx = ::$proto_ns$::internal::LookUpEnumName(\n      $classname$_entries,\n      $classname$_entries_by_number,\n      $1$, value);\n  return idx == -1 ? ::$proto_ns$::internal::GetEmptyString() :\n                     $classname$_strings[idx].get();\n}\n"
               ,(int *)&local_138);
    local_138 = (_Base_ptr)CONCAT44(local_138._4_4_,*(undefined4 *)(this->descriptor_ + 4));
    Formatter::operator()
              (&format,
               "bool $classname$_Parse(\n    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, $classname$* value) {\n  int int_value;\n  bool success = ::$proto_ns$::internal::LookUpEnumValue(\n      $classname$_entries, $1$, name, &int_value);\n  if (success) {\n    *value = static_cast<$classname$>(int_value);\n  }\n  return success;\n}\n"
               ,(int *)&local_138);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&number_to_index._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&number_to_canonical_name._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&name_to_number._M_t);
    descriptor_00 = extraout_RDX_01;
  }
  if (*(cpp **)(this->descriptor_ + 0x18) != (cpp *)0x0) {
    ClassName_abi_cxx11_
              ((string *)&name_to_number,*(cpp **)(this->descriptor_ + 0x18),descriptor_00);
    Formatter::operator()<>
              (&format,
               "#if (__cplusplus < 201703) && (!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n"
              );
    lVar11 = 0;
    enum_value = extraout_RDX_02;
    for (lVar9 = 0; lVar9 < *(int *)(this->descriptor_ + 4); lVar9 = lVar9 + 1) {
      EnumValueName_abi_cxx11_
                ((string *)&number_to_canonical_name,
                 (cpp *)(*(long *)(this->descriptor_ + 0x28) + lVar11),enum_value);
      Formatter::operator()
                (&format,"constexpr $classname$ $1$::$2$;\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &name_to_number,(string *)&number_to_canonical_name);
      std::__cxx11::string::~string((string *)&number_to_canonical_name);
      lVar11 = lVar11 + 0x20;
      enum_value = extraout_RDX_03;
    }
    Formatter::operator()
              (&format,
               "constexpr $classname$ $1$::$nested_name$_MIN;\nconstexpr $classname$ $1$::$nested_name$_MAX;\n"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name_to_number
              );
    if (this->generate_array_size_ == true) {
      Formatter::operator()
                (&format,"constexpr int $1$::$nested_name$_ARRAYSIZE;\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &name_to_number);
    }
    Formatter::operator()<>
              (&format,
               "#endif  // (__cplusplus < 201703) && (!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n"
              );
    std::__cxx11::string::~string((string *)&name_to_number);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&numbers._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void EnumGenerator::GenerateMethods(int idx, io::Printer* printer) {
  Formatter format(printer, variables_);
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "const ::$proto_ns$::EnumDescriptor* $classname$_descriptor() {\n"
        "  ::$proto_ns$::internal::AssignDescriptors(&$desc_table$);\n"
        "  return $file_level_enum_descriptors$[$1$];\n"
        "}\n",
        idx);
  }

  format(
      "bool $classname$_IsValid(int value) {\n"
      "  switch (value) {\n");

  // Multiple values may have the same number.  Make sure we only cover
  // each number once by first constructing a set containing all valid
  // numbers, then printing a case statement for each element.

  std::set<int> numbers;
  for (int j = 0; j < descriptor_->value_count(); j++) {
    const EnumValueDescriptor* value = descriptor_->value(j);
    numbers.insert(value->number());
  }

  for (std::set<int>::iterator iter = numbers.begin(); iter != numbers.end();
       ++iter) {
    format("    case $1$:\n", Int32ToString(*iter));
  }

  format(
      "      return true;\n"
      "    default:\n"
      "      return false;\n"
      "  }\n"
      "}\n"
      "\n");

  if (!HasDescriptorMethods(descriptor_->file(), options_)) {
    // In lite mode (where descriptors are unavailable), we generate separate
    // tables for mapping between enum names and numbers. The _entries table
    // contains the bulk of the data and is sorted by name, while
    // _entries_by_number is sorted by number and just contains pointers into
    // _entries. The two tables allow mapping from name to number and number to
    // name, both in time logarithmic in the number of enum entries. This could
    // probably be made faster, but for now the tables are intended to be simple
    // and compact.
    //
    // Enums with allow_alias = true support multiple entries with the same
    // numerical value. In cases where there are multiple names for the same
    // number, we treat the first name appearing in the .proto file as the
    // canonical one.
    std::map<std::string, int> name_to_number;
    std::map<int, std::string> number_to_canonical_name;
    for (int i = 0; i < descriptor_->value_count(); i++) {
      const EnumValueDescriptor* value = descriptor_->value(i);
      name_to_number.emplace(value->name(), value->number());
      // The same number may appear with multiple names, so we use emplace() to
      // let the first name win.
      number_to_canonical_name.emplace(value->number(), value->name());
    }

    format(
        "static ::$proto_ns$::internal::ExplicitlyConstructed<std::string> "
        "$classname$_strings[$1$] = {};\n\n",
        CountUniqueValues(descriptor_));

    // We concatenate all the names for a given enum into one big string
    // literal. If instead we store an array of string literals, the linker
    // seems to put all enum strings for a given .proto file in the same
    // section, which hinders its ability to strip out unused strings.
    format("static const char $classname$_names[] =");
    for (const auto& p : name_to_number) {
      format("\n  \"$1$\"", p.first);
    }
    format(";\n\n");

    format(
        "static const ::$proto_ns$::internal::EnumEntry $classname$_entries[] "
        "= {\n");
    int i = 0;
    std::map<int, int> number_to_index;
    int data_index = 0;
    for (const auto& p : name_to_number) {
      format("  { {$classname$_names + $1$, $2$}, $3$ },\n", data_index,
             p.first.size(), p.second);
      if (number_to_canonical_name[p.second] == p.first) {
        number_to_index.emplace(p.second, i);
      }
      ++i;
      data_index += p.first.size();
    }

    format(
        "};\n"
        "\n"
        "static const int $classname$_entries_by_number[] = {\n");
    for (const auto& p : number_to_index) {
      format("  $1$, // $2$ -> $3$\n", p.second, p.first,
             number_to_canonical_name[p.first]);
    }
    format(
        "};\n"
        "\n");

    format(
        "const std::string& $classname$_Name(\n"
        "    $classname$ value) {\n"
        "  static const bool dummy =\n"
        "      ::$proto_ns$::internal::InitializeEnumStrings(\n"
        "          $classname$_entries,\n"
        "          $classname$_entries_by_number,\n"
        "          $1$, $classname$_strings);\n"
        "  (void) dummy;\n"
        "  int idx = ::$proto_ns$::internal::LookUpEnumName(\n"
        "      $classname$_entries,\n"
        "      $classname$_entries_by_number,\n"
        "      $1$, value);\n"
        "  return idx == -1 ? ::$proto_ns$::internal::GetEmptyString() :\n"
        "                     $classname$_strings[idx].get();\n"
        "}\n",
        CountUniqueValues(descriptor_));
    format(
        "bool $classname$_Parse(\n"
        "    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, $classname$* "
        "value) "
        "{\n"
        "  int int_value;\n"
        "  bool success = ::$proto_ns$::internal::LookUpEnumValue(\n"
        "      $classname$_entries, $1$, name, &int_value);\n"
        "  if (success) {\n"
        "    *value = static_cast<$classname$>(int_value);\n"
        "  }\n"
        "  return success;\n"
        "}\n",
        descriptor_->value_count());
  }

  if (descriptor_->containing_type() != NULL) {
    std::string parent = ClassName(descriptor_->containing_type(), false);
    // Before C++17, we must define the static constants which were
    // declared in the header, to give the linker a place to put them.
    // But MSVC++ pre-2015 and post-2017 (version 15.5+) insists that we not.
    format(
        "#if (__cplusplus < 201703) && "
        "(!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n");

    for (int i = 0; i < descriptor_->value_count(); i++) {
      format("constexpr $classname$ $1$::$2$;\n", parent,
             EnumValueName(descriptor_->value(i)));
    }
    format(
        "constexpr $classname$ $1$::$nested_name$_MIN;\n"
        "constexpr $classname$ $1$::$nested_name$_MAX;\n",
        parent);
    if (generate_array_size_) {
      format("constexpr int $1$::$nested_name$_ARRAYSIZE;\n", parent);
    }

    format(
        "#endif  // (__cplusplus < 201703) && "
        "(!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n");
  }
}